

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O3

void * deAlignedRealloc(void *ptr,size_t numBytes,size_t alignBytes)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  void *ptr_1;
  void *local_30;
  
  if (ptr == (void *)0x0) {
    local_30 = (void *)0x0;
    iVar2 = posix_memalign(&local_30,alignBytes + 7 & 0xfffffffffffffff8,numBytes);
    if (iVar2 != 0) {
      return (void *)0x0;
    }
    return local_30;
  }
  if (numBytes == 0) {
    free(ptr);
  }
  else {
    uVar3 = malloc_usable_size(ptr);
    if (numBytes <= uVar3 && uVar3 <= numBytes * 2) {
      return ptr;
    }
    local_30 = (void *)0x0;
    iVar2 = posix_memalign(&local_30,alignBytes + 7 & 0xfffffffffffffff8,numBytes);
    pvVar1 = local_30;
    if (local_30 != (void *)0x0 && iVar2 == 0) {
      if (uVar3 < numBytes) {
        numBytes = uVar3;
      }
      memcpy(local_30,ptr,numBytes);
      free(ptr);
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* deAlignedRealloc (void* ptr, size_t numBytes, size_t alignBytes)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	return _aligned_realloc(ptr, numBytes, alignBytes);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC) || (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	if (ptr)
	{
		if (numBytes > 0)
		{
#	if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
			const size_t				oldSize	= getAlignedAllocHeader(ptr)->numBytes;
#	else /* DE_ALIGNED_MALLOC_GENERIC */
			const size_t				oldSize	= malloc_usable_size(ptr);
#	endif

			DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));

			if (oldSize < numBytes || oldSize > numBytes*2)
			{
				/* Create a new alloc if original is smaller, or more than twice the requested size */
				void* const	newPtr	= deAlignedMalloc(numBytes, alignBytes);

				if (newPtr)
				{
					const size_t	copyBytes	= numBytes < oldSize ? numBytes : oldSize;

					deMemcpy(newPtr, ptr, copyBytes);
					deAlignedFree(ptr);

					return newPtr;
				}
				else
					return DE_NULL;
			}
			else
				return ptr;
		}
		else
		{
			deAlignedFree(ptr);
			return DE_NULL;
		}
	}
	else
		return deAlignedMalloc(numBytes, alignBytes);

#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}